

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestCase
               (ostream *stream,TestCase *test_case)

{
  char *test_case_name;
  int iVar1;
  ostream *poVar2;
  TestInfo *pTVar3;
  int width;
  int width_00;
  int width_01;
  TimeInMillis ms;
  int i;
  bool bVar4;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string kIndent;
  string local_70;
  string kTestsuite;
  
  std::__cxx11::string::string((string *)&kTestsuite,"testsuite",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x6,width);
  Indent_abi_cxx11_(&local_b8,(internal *)0x4,width_00);
  poVar2 = std::operator<<(stream,(string *)&local_b8);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"name",&local_b9);
  std::__cxx11::string::string((string *)&local_70,(test_case->name_)._M_dataplus._M_p,&local_91);
  OutputJsonKey(stream,&kTestsuite,&local_b8,&local_70,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"tests",(allocator *)&local_70);
  iVar1 = TestCase::reportable_test_count(test_case);
  OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"failures",(allocator *)&local_70);
  iVar1 = TestCase::failed_test_count(test_case);
  OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"disabled",(allocator *)&local_70);
  iVar1 = TestCase::reportable_disabled_test_count(test_case);
  OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"errors",(allocator *)&local_70);
  OutputJsonKey(stream,&kTestsuite,&local_b8,0,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_b8,"time",&local_b9);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_70,(internal *)test_case->elapsed_time_,ms);
  OutputJsonKey(stream,&kTestsuite,&local_b8,&local_70,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b8);
  TestPropertiesAsJson(&local_b8,&test_case->ad_hoc_test_result_,&kIndent);
  poVar2 = std::operator<<(stream,(string *)&local_b8);
  std::operator<<(poVar2,",\n");
  std::__cxx11::string::~string((string *)&local_b8);
  poVar2 = std::operator<<(stream,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)&kTestsuite);
  std::operator<<(poVar2,"\": [\n");
  bVar4 = false;
  for (iVar1 = 0;
      iVar1 < (int)((ulong)((long)(test_case->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(test_case->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar1 = iVar1 + 1
      ) {
    pTVar3 = TestCase::GetTestInfo(test_case,iVar1);
    if ((pTVar3->matches_filter_ == true) && ((pTVar3->is_in_another_shard_ & 1U) == 0)) {
      if (bVar4) {
        std::operator<<(stream,",\n");
      }
      test_case_name = (test_case->name_)._M_dataplus._M_p;
      pTVar3 = TestCase::GetTestInfo(test_case,iVar1);
      bVar4 = true;
      OutputJsonTestInfo(stream,test_case_name,pTVar3);
    }
  }
  poVar2 = std::operator<<(stream,"\n");
  poVar2 = std::operator<<(poVar2,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"]\n");
  Indent_abi_cxx11_(&local_b8,(internal *)0x4,width_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestCase(std::ostream* stream,
                                                  const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_case.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_case.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "failures", test_case.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "disabled",
                test_case.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(test_case.elapsed_time()), kIndent,
                false);
  *stream << TestPropertiesAsJson(test_case.ad_hoc_test_result(), kIndent)
          << ",\n";

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}